

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O2

uint qc_hashbin(void *key,uint uLength,uint bucket_count)

{
  int iVar1;
  __int32_t **pp_Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  
  iVar4 = 0;
  iVar1 = 0;
  iVar6 = 0;
  for (lVar5 = 0; uLength != (uint)lVar5; lVar5 = lVar5 + 1) {
    bVar7 = iVar1 == 5;
    iVar3 = 0;
    if (bVar7) {
      iVar3 = iVar6;
    }
    iVar6 = iVar6 * 9;
    if (bVar7) {
      iVar6 = 0;
    }
    iVar1 = iVar1 + 1;
    if (bVar7) {
      iVar1 = 1;
    }
    iVar4 = iVar4 + iVar3;
    pp_Var2 = __ctype_tolower_loc();
    iVar6 = iVar6 + (*pp_Var2)[*(byte *)((long)key + lVar5)];
  }
  return (uint)(iVar6 + iVar4) % bucket_count;
}

Assistant:

unsigned int qc_hashbin(void *key, unsigned int uLength, unsigned int bucket_count)
{
    unsigned char *psz;
    unsigned int hash_value;
    unsigned int ret;
    unsigned int i;
    unsigned int j;

    psz = (unsigned char *)key;
    hash_value = 0;

    j = 0;
    ret = 0;
    i = 0;
    while(i < uLength)
    {
	    if(j == 5)
	    {
		    j = 0;
		    ret += hash_value;
		    hash_value = 0;
	    }
	    hash_value += hash_value << 3;
	    hash_value += (unsigned int)tolower( *psz );
	    psz++;
	    j++;
	    i++;
    }

    ret += hash_value;

    return ret % bucket_count;
}